

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2closest_edge_query_base.h
# Opt level: O0

void __thiscall
S2ClosestEdgeQueryBase<S2MinDistance>::AddResult
          (S2ClosestEdgeQueryBase<S2MinDistance> *this,Result *result)

{
  int32 iVar1;
  int iVar2;
  int iVar3;
  Options *pOVar4;
  size_type sVar5;
  btree_iterator<gtl::internal_btree::btree_node<gtl::internal_btree::set_params<S2ClosestEdgeQueryBase<S2MinDistance>::Result,_std::less<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_256,_false>_>,_S2ClosestEdgeQueryBase<S2MinDistance>::Result_&,_S2ClosestEdgeQueryBase<S2MinDistance>::Result_*>
  *pbVar6;
  pointer this_00;
  S2MinDistance SVar7;
  Delta delta;
  iterator iVar8;
  iterator iVar9;
  btree_iterator<gtl::internal_btree::btree_node<gtl::internal_btree::set_params<S2ClosestEdgeQueryBase<S2MinDistance>::Result,_std::less<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_256,_false>_>,_S2ClosestEdgeQueryBase<S2MinDistance>::Result_&,_S2ClosestEdgeQueryBase<S2MinDistance>::Result_*>
  local_a0;
  S1ChordAngle local_90;
  btree_node<gtl::internal_btree::set_params<S2ClosestEdgeQueryBase<S2MinDistance>::Result,_std::less<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_256,_false>_>
  *local_80;
  int local_78;
  btree_node<gtl::internal_btree::set_params<S2ClosestEdgeQueryBase<S2MinDistance>::Result,_std::less<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_256,_false>_>
  *local_70;
  int local_68;
  btree_iterator<gtl::internal_btree::btree_node<gtl::internal_btree::set_params<S2ClosestEdgeQueryBase<S2MinDistance>::Result,_std::less<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_256,_false>_>,_S2ClosestEdgeQueryBase<S2MinDistance>::Result_&,_S2ClosestEdgeQueryBase<S2MinDistance>::Result_*>
  local_60;
  int local_4c;
  undefined1 local_48 [4];
  int size;
  double local_30;
  S1ChordAngle local_28;
  Result *local_18;
  Result *result_local;
  S2ClosestEdgeQueryBase<S2MinDistance> *this_local;
  
  local_18 = result;
  result_local = (Result *)this;
  pOVar4 = options(this);
  iVar2 = Options::max_results(pOVar4);
  if (iVar2 == 1) {
    (this->result_singleton_).distance_.super_S1ChordAngle.length2_ =
         (local_18->distance_).super_S1ChordAngle.length2_;
    iVar1 = local_18->edge_id_;
    (this->result_singleton_).shape_id_ = local_18->shape_id_;
    (this->result_singleton_).edge_id_ = iVar1;
    local_28.length2_ = (double)Result::distance(local_18);
    pOVar4 = options(this);
    local_30 = (double)Options::max_error(pOVar4);
    SVar7 = ::operator-((S2MinDistance)local_28.length2_,(S1ChordAngle)local_30);
    (this->distance_limit_).super_S1ChordAngle.length2_ = (double)SVar7.super_S1ChordAngle.length2_;
  }
  else {
    pOVar4 = options(this);
    iVar2 = Options::max_results(pOVar4);
    if (iVar2 == 0x7fffffff) {
      std::
      vector<S2ClosestEdgeQueryBase<S2MinDistance>::Result,_std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>_>
      ::push_back(&this->result_vector_,local_18);
    }
    else {
      gtl::internal_btree::
      btree_set_container<gtl::internal_btree::btree<gtl::internal_btree::set_params<S2ClosestEdgeQueryBase<S2MinDistance>::Result,_std::less<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_256,_false>_>_>
      ::insert((pair<gtl::internal_btree::btree_iterator<gtl::internal_btree::btree_node<gtl::internal_btree::set_params<S2ClosestEdgeQueryBase<S2MinDistance>::Result,_std::less<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_256,_false>_>,_S2ClosestEdgeQueryBase<S2MinDistance>::Result_&,_S2ClosestEdgeQueryBase<S2MinDistance>::Result_*>,_bool>
                *)local_48,
               &(this->result_set_).
                super_btree_set_container<gtl::internal_btree::btree<gtl::internal_btree::set_params<S2ClosestEdgeQueryBase<S2MinDistance>::Result,_std::less<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_256,_false>_>_>
               ,local_18);
      sVar5 = gtl::internal_btree::
              btree_container<gtl::internal_btree::btree<gtl::internal_btree::set_params<S2ClosestEdgeQueryBase<S2MinDistance>::Result,_std::less<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_256,_false>_>_>
              ::size((btree_container<gtl::internal_btree::btree<gtl::internal_btree::set_params<S2ClosestEdgeQueryBase<S2MinDistance>::Result,_std::less<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_256,_false>_>_>
                      *)&this->result_set_);
      local_4c = (int)sVar5;
      pOVar4 = options(this);
      iVar3 = Options::max_results(pOVar4);
      iVar2 = local_4c;
      if (iVar3 <= (int)sVar5) {
        pOVar4 = options(this);
        iVar3 = Options::max_results(pOVar4);
        if (iVar3 < iVar2) {
          iVar8 = gtl::internal_btree::
                  btree_container<gtl::internal_btree::btree<gtl::internal_btree::set_params<S2ClosestEdgeQueryBase<S2MinDistance>::Result,_std::less<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_256,_false>_>_>
                  ::end((btree_container<gtl::internal_btree::btree<gtl::internal_btree::set_params<S2ClosestEdgeQueryBase<S2MinDistance>::Result,_std::less<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_256,_false>_>_>
                         *)&this->result_set_);
          local_70 = iVar8.node;
          local_68 = iVar8.position;
          local_60.node = local_70;
          local_60.position = local_68;
          pbVar6 = gtl::internal_btree::
                   btree_iterator<gtl::internal_btree::btree_node<gtl::internal_btree::set_params<S2ClosestEdgeQueryBase<S2MinDistance>::Result,_std::less<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_256,_false>_>,_S2ClosestEdgeQueryBase<S2MinDistance>::Result_&,_S2ClosestEdgeQueryBase<S2MinDistance>::Result_*>
                   ::operator--(&local_60);
          iVar9 = gtl::internal_btree::
                  btree_set_container<gtl::internal_btree::btree<gtl::internal_btree::set_params<S2ClosestEdgeQueryBase<S2MinDistance>::Result,_std::less<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_256,_false>_>_>
                  ::erase(&(this->result_set_).
                           super_btree_set_container<gtl::internal_btree::btree<gtl::internal_btree::set_params<S2ClosestEdgeQueryBase<S2MinDistance>::Result,_std::less<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_256,_false>_>_>
                          ,pbVar6);
          local_80 = iVar9.node;
          local_78 = iVar9.position;
        }
        iVar8 = gtl::internal_btree::
                btree_container<gtl::internal_btree::btree<gtl::internal_btree::set_params<S2ClosestEdgeQueryBase<S2MinDistance>::Result,_std::less<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_256,_false>_>_>
                ::end((btree_container<gtl::internal_btree::btree<gtl::internal_btree::set_params<S2ClosestEdgeQueryBase<S2MinDistance>::Result,_std::less<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_256,_false>_>_>
                       *)&this->result_set_);
        local_a0.node = iVar8.node;
        local_a0.position = iVar8.position;
        pbVar6 = gtl::internal_btree::
                 btree_iterator<gtl::internal_btree::btree_node<gtl::internal_btree::set_params<S2ClosestEdgeQueryBase<S2MinDistance>::Result,_std::less<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_256,_false>_>,_S2ClosestEdgeQueryBase<S2MinDistance>::Result_&,_S2ClosestEdgeQueryBase<S2MinDistance>::Result_*>
                 ::operator--(&local_a0);
        this_00 = gtl::internal_btree::
                  btree_iterator<gtl::internal_btree::btree_node<gtl::internal_btree::set_params<S2ClosestEdgeQueryBase<S2MinDistance>::Result,_std::less<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_256,_false>_>,_S2ClosestEdgeQueryBase<S2MinDistance>::Result_&,_S2ClosestEdgeQueryBase<S2MinDistance>::Result_*>
                  ::operator->(pbVar6);
        local_90.length2_ = (double)Result::distance(this_00);
        pOVar4 = options(this);
        delta = Options::max_error(pOVar4);
        SVar7 = ::operator-((S2MinDistance)local_90.length2_,(S1ChordAngle)delta.length2_);
        (this->distance_limit_).super_S1ChordAngle.length2_ =
             (double)SVar7.super_S1ChordAngle.length2_;
      }
    }
  }
  return;
}

Assistant:

void S2ClosestEdgeQueryBase<Distance>::AddResult(const Result& result) {
  if (options().max_results() == 1) {
    // Optimization for the common case where only the closest edge is wanted.
    result_singleton_ = result;
    distance_limit_ = result.distance() - options().max_error();
  } else if (options().max_results() == Options::kMaxMaxResults) {
    result_vector_.push_back(result);  // Sort/unique at end.
  } else {
    // Add this edge to result_set_.  Note that even if we already have enough
    // edges, we can't erase an element before insertion because the "new"
    // edge might in fact be a duplicate.
    result_set_.insert(result);
    int size = result_set_.size();
    if (size >= options().max_results()) {
      if (size > options().max_results()) {
        result_set_.erase(--result_set_.end());
      }
      distance_limit_ = (--result_set_.end())->distance() -
                        options().max_error();
    }
  }
}